

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqdebug.cpp
# Opt level: O0

SQString * __thiscall SQVM::PrintObjVal(SQVM *this,SQObjectPtr *o)

{
  int iVar1;
  SQChar *pSVar2;
  int *in_RSI;
  long in_RDI;
  SQInteger in_stack_ffffffffffffffc0;
  SQInteger len;
  SQChar *in_stack_ffffffffffffffc8;
  SQSharedState *in_stack_ffffffffffffffd0;
  SQSharedState *this_00;
  SQString *local_8;
  
  iVar1 = *in_RSI;
  if (iVar1 == 0x5000002) {
    pSVar2 = SQSharedState::GetScratchPad
                       (in_stack_ffffffffffffffd0,(SQInteger)in_stack_ffffffffffffffc8);
    snprintf(pSVar2,0x32,"%lld",*(undefined8 *)(in_RSI + 2));
    this_00 = *(SQSharedState **)(in_RDI + 0x118);
    SQSharedState::GetScratchPad(this_00,(SQInteger)in_stack_ffffffffffffffc8);
    local_8 = SQString::Create(this_00,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  }
  else if (iVar1 == 0x5000004) {
    pSVar2 = SQSharedState::GetScratchPad
                       (in_stack_ffffffffffffffd0,(SQInteger)in_stack_ffffffffffffffc8);
    snprintf(pSVar2,0x32,"%.14g",(double)(float)in_RSI[2]);
    pSVar2 = *(SQChar **)(in_RDI + 0x118);
    SQSharedState::GetScratchPad(in_stack_ffffffffffffffd0,(SQInteger)pSVar2);
    local_8 = SQString::Create(in_stack_ffffffffffffffd0,pSVar2,in_stack_ffffffffffffffc0);
  }
  else if (iVar1 == 0x8000010) {
    local_8 = *(SQString **)(in_RSI + 2);
  }
  else {
    len = *(SQInteger *)(in_RDI + 0x118);
    GetTypeName((SQObjectPtr *)0x11bafc);
    local_8 = SQString::Create(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,len);
  }
  return local_8;
}

Assistant:

SQString *SQVM::PrintObjVal(const SQObjectPtr &o)
{
    switch(sq_type(o)) {
    case OT_STRING: return _string(o);
    case OT_INTEGER:
        scsprintf(_sp(sq_rsl(NUMBER_MAX_CHAR+1)),sq_rsl(NUMBER_MAX_CHAR), _PRINT_INT_FMT, _integer(o));
        return SQString::Create(_ss(this), _spval);
        break;
    case OT_FLOAT:
        scsprintf(_sp(sq_rsl(NUMBER_MAX_CHAR+1)), sq_rsl(NUMBER_MAX_CHAR), _SC("%.14g"), _float(o));
        return SQString::Create(_ss(this), _spval);
        break;
    default:
        return SQString::Create(_ss(this), GetTypeName(o));
    }
}